

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

TermList ApplicativeHelper::createAppTerm
                   (TermList s1,TermList s2,TermList arg1,TermList arg2,bool shared)

{
  TermList elem;
  TermList elem_00;
  TermList elem_01;
  TermList elem_02;
  int iVar1;
  uint uVar2;
  TermList *in_RDX;
  undefined8 in_RSI;
  byte in_R8B;
  uint app;
  Signature *in_stack_00000040;
  uint in_stack_00000048;
  undefined3 in_stack_0000004c;
  Term *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Stack<Kernel::TermList> *in_stack_ffffffffffffffa0;
  uint64_t local_8;
  
  if (createAppTerm(Kernel::TermList,Kernel::TermList,Kernel::TermList,Kernel::TermList,bool)::args
      == '\0') {
    iVar1 = __cxa_guard_acquire(&createAppTerm(Kernel::TermList,Kernel::TermList,Kernel::TermList,Kernel::TermList,bool)
                                 ::args);
    if (iVar1 != 0) {
      Lib::Stack<Kernel::TermList>::Stack
                (in_stack_ffffffffffffffa0,
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&createAppTerm::args,&__dso_handle);
      __cxa_guard_release(&createAppTerm(Kernel::TermList,Kernel::TermList,Kernel::TermList,Kernel::TermList,bool)
                           ::args);
    }
  }
  Lib::Stack<Kernel::TermList>::reset(&createAppTerm::args);
  elem._content._4_4_ = in_stack_ffffffffffffff94;
  elem._content._0_4_ = in_stack_ffffffffffffff90;
  Lib::Stack<Kernel::TermList>::push((Stack<Kernel::TermList> *)in_stack_ffffffffffffff88,elem);
  elem_00._content._4_4_ = in_stack_ffffffffffffff94;
  elem_00._content._0_4_ = in_stack_ffffffffffffff90;
  Lib::Stack<Kernel::TermList>::push((Stack<Kernel::TermList> *)in_stack_ffffffffffffff88,elem_00);
  elem_01._content._4_4_ = in_stack_ffffffffffffff94;
  elem_01._content._0_4_ = in_stack_ffffffffffffff90;
  Lib::Stack<Kernel::TermList>::push((Stack<Kernel::TermList> *)in_stack_ffffffffffffff88,elem_01);
  elem_02._content._4_4_ = in_stack_ffffffffffffff94;
  elem_02._content._0_4_ = in_stack_ffffffffffffff90;
  Lib::Stack<Kernel::TermList>::push((Stack<Kernel::TermList> *)in_stack_ffffffffffffff88,elem_02);
  uVar2 = Kernel::Signature::getApp(in_stack_00000040);
  if ((in_R8B & 1) == 0) {
    Lib::Stack<Kernel::TermList>::begin(&createAppTerm::args);
    Kernel::Term::createNonShared((uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,in_RDX);
    Kernel::TermList::TermList
              ((TermList *)CONCAT44(uVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
  }
  else {
    Lib::Stack<Kernel::TermList>::begin(&createAppTerm::args);
    Kernel::Term::create(_in_stack_0000004c,in_stack_00000048,(TermList *)in_stack_00000040);
    Kernel::TermList::TermList
              ((TermList *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  }
  return (TermList)local_8;
}

Assistant:

TermList ApplicativeHelper::createAppTerm(TermList s1, TermList s2, TermList arg1, TermList arg2, bool shared)
{
  static TermStack args;
  args.reset();
  args.push(s1);
  args.push(s2);
  args.push(arg1);
  args.push(arg2);
  unsigned app = env.signature->getApp();
  if(shared){
    return TermList(Term::create(app, 4, args.begin()));
  }
  return TermList(Term::createNonShared(app, 4, args.begin()));    
}